

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr0.c
# Opt level: O0

void save_shifts(void)

{
  shifts *psVar1;
  shifts *psVar2;
  Yshort *pYVar3;
  Yshort *send;
  Yshort *sp2;
  Yshort *sp1;
  shifts *p;
  
  psVar2 = (shifts *)allocate((nshifts + -1) * 4 + 0x18);
  psVar2->number = this_state->number;
  psVar2->nshifts = nshifts;
  sp2 = shiftset;
  pYVar3 = shiftset + nshifts;
  send = psVar2->shift;
  while (sp2 < pYVar3) {
    *send = *sp2;
    send = send + 1;
    sp2 = sp2 + 1;
  }
  psVar1 = psVar2;
  if (last_shift != (shifts *)0x0) {
    last_shift->next = psVar2;
    psVar1 = first_shift;
  }
  first_shift = psVar1;
  last_shift = psVar2;
  return;
}

Assistant:

void save_shifts()
{
    register shifts *p;
    register Yshort *sp1;
    register Yshort *sp2;
    register Yshort *send;

    p = (shifts *) allocate((unsigned) (sizeof(shifts) +
			(nshifts - 1) * sizeof(Yshort)));

    p->number = this_state->number;
    p->nshifts = nshifts;

    sp1 = shiftset;
    sp2 = p->shift;
    send = shiftset + nshifts;

    while (sp1 < send)
	*sp2++ = *sp1++;

    if (last_shift)
    {
	last_shift->next = p;
	last_shift = p;
    }
    else
    {
	first_shift = p;
	last_shift = p;
    }
}